

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O1

size_t __thiscall
Potassco::ProgramOptions::DefaultFormat::format
          (DefaultFormat *this,vector<char,_std::allocator<char>_> *buffer,OptionGroup *grp)

{
  pointer *ppcVar1;
  pointer pcVar2;
  size_type sVar3;
  iterator iVar4;
  pointer pcVar5;
  undefined8 in_RAX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar6;
  
  pcVar2 = (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
      _M_finish != pcVar2) {
    (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
    _M_finish = pcVar2;
  }
  sVar3 = (grp->caption_)._M_string_length;
  if (sVar3 != 0) {
    std::vector<char,_std::allocator<char>_>::reserve(buffer,sVar3 + 4);
    uVar6 = CONCAT17(10,(int7)in_RAX);
    iVar4._M_current =
         (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar4._M_current ==
        (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                (buffer,iVar4,&stack0xffffffffffffffef);
    }
    else {
      *iVar4._M_current = '\n';
      ppcVar1 = &(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    pcVar5 = (grp->caption_)._M_dataplus._M_p;
    std::vector<char,std::allocator<char>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
              ((vector<char,std::allocator<char>> *)buffer,
               (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish,pcVar5,pcVar5 + (grp->caption_)._M_string_length,
               in_R8,in_R9,uVar6);
    iVar4._M_current =
         (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar4._M_current ==
        (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                (buffer,iVar4,&stack0xffffffffffffffee);
    }
    else {
      *iVar4._M_current = ':';
      ppcVar1 = &(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    iVar4._M_current =
         (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar4._M_current ==
        (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                (buffer,iVar4,&stack0xffffffffffffffed);
    }
    else {
      *iVar4._M_current = '\n';
      ppcVar1 = &(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    iVar4._M_current =
         (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    if (iVar4._M_current ==
        (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
                (buffer,iVar4,&stack0xffffffffffffffec);
    }
    else {
      *iVar4._M_current = '\n';
      ppcVar1 = &(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
  }
  return (long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
}

Assistant:

std::size_t DefaultFormat::format(std::vector<char>& buffer, const OptionGroup& grp) {
	buffer.clear();
	if (grp.caption().length()) {
		buffer.reserve(grp.caption().length() + 4);
		buffer.push_back('\n');
		buffer.insert(buffer.end(), grp.caption().begin(), grp.caption().end());
		buffer.push_back(':');
		buffer.push_back('\n');
		buffer.push_back('\n');
	}
	return buffer.size();
}